

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O2

void st__free_table(st__table *table)

{
  st__table_entry *psVar1;
  st__table_entry *__ptr;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < table->num_bins; lVar2 = lVar2 + 1) {
    __ptr = table->bins[lVar2];
    while (__ptr != (st__table_entry *)0x0) {
      psVar1 = __ptr->next;
      free(__ptr);
      __ptr = psVar1;
    }
  }
  free(table->bins);
  free(table);
  return;
}

Assistant:

void
 st__free_table( st__table *table)
{
    st__table_entry *ptr, *next;
    int i;

    for(i = 0; i < table->num_bins ; i++) {
    ptr = table->bins[i];
    while (ptr != NULL) {
        next = ptr->next;
        ABC_FREE(ptr);
        ptr = next;
    }
    }
    ABC_FREE(table->bins);
    ABC_FREE(table);
}